

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_topointer(lua_State *L,int idx)

{
  byte bVar1;
  TValue *o_00;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  o_00 = index2value(L,idx);
  bVar1 = o_00->tt_ & 0x3f;
  if ((bVar1 == 2) || (bVar1 == 7)) {
    L_local = (lua_State *)touserdata(o_00);
  }
  else if (bVar1 == 0x16) {
    L_local = (lua_State *)(o_00->value_).gc;
  }
  else if ((o_00->tt_ & 0x40) == 0) {
    L_local = (lua_State *)0x0;
  }
  else {
    L_local = (lua_State *)(o_00->value_).gc;
  }
  return L_local;
}

Assistant:

LUA_API const void *lua_topointer (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VLCF: return cast_voidp(cast_sizet(fvalue(o)));
    case LUA_VUSERDATA: case LUA_VLIGHTUSERDATA:
      return touserdata(o);
    default: {
      if (iscollectable(o))
        return gcvalue(o);
      else
        return NULL;
    }
  }
}